

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  string local_138;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_118;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_f8;
  Resources res;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_a8;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_48;
  
  Environment::Environment(&env,context,4);
  PipelineLayout::Resources::Resources(&res,&env,params);
  PipelineLayout::create((Move<vk::Handle<(vk::HandleType)16>_> *)&local_118,&env,&res,params);
  local_138.field_2._M_allocated_capacity = (size_type)local_118.m_data.deleter.m_device;
  local_138.field_2._8_8_ = local_118.m_data.deleter.m_allocator;
  local_138._M_dataplus._M_p = (pointer)local_118.m_data.object.m_internal;
  local_138._M_string_length = (size_type)local_118.m_data.deleter.m_deviceIface;
  local_118.m_data.object.m_internal = 0;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_118.m_data.deleter.m_device = (VkDevice)0x0;
  local_118.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_118);
  PipelineLayout::create((Move<vk::Handle<(vk::HandleType)16>_> *)&local_f8,&env,&res,params);
  local_118.m_data.deleter.m_device = local_f8.m_data.deleter.m_device;
  local_118.m_data.deleter.m_allocator = local_f8.m_data.deleter.m_allocator;
  local_118.m_data.object.m_internal = local_f8.m_data.object.m_internal;
  local_118.m_data.deleter.m_deviceIface = local_f8.m_data.deleter.m_deviceIface;
  local_f8.m_data.object.m_internal = 0;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_f8);
  PipelineLayout::create((Move<vk::Handle<(vk::HandleType)16>_> *)&local_a8,&env,&res,params);
  local_f8.m_data.deleter.m_device = local_a8.m_data.deleter.m_device;
  local_f8.m_data.deleter.m_allocator = local_a8.m_data.deleter.m_allocator;
  local_f8.m_data.object.m_internal = local_a8.m_data.object.m_internal;
  local_f8.m_data.deleter.m_deviceIface = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_a8);
  PipelineLayout::create((Move<vk::Handle<(vk::HandleType)16>_> *)&local_48,&env,&res,params);
  local_a8.m_data.deleter.m_device = local_48.m_data.deleter.m_device;
  local_a8.m_data.deleter.m_allocator = local_48.m_data.deleter.m_allocator;
  local_a8.m_data.object.m_internal = local_48.m_data.object.m_internal;
  local_a8.m_data.deleter.m_deviceIface = local_48.m_data.deleter.m_deviceIface;
  local_48.m_data.object.m_internal = 0;
  local_48.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_48.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_48);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_118);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"Ok",(allocator<char> *)&local_118);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  PipelineLayout::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}